

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<char>::BaseFab
          (BaseFab<char> *this,BaseFab<char> *rhs,MakeType make_type,int scomp,int ncomp)

{
  Arena *ar;
  char *pcVar1;
  Long LVar2;
  int in_EDX;
  long in_RSI;
  Box *in_RDI;
  uint in_R8D;
  int in_stack_00000154;
  Box *in_stack_00000158;
  int in_stack_00000164;
  Box *in_stack_00000168;
  BaseFab<char> *in_stack_00000170;
  BaseFab<char> *in_stack_00000178;
  int in_stack_00000420;
  BaseFab<char> *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_00 = (BaseFab<char> *)((long)(in_RDI->smallend).vect + 8);
  ar = DataAllocator::arena((DataAllocator *)in_RDI);
  DataAllocator::DataAllocator((DataAllocator *)this_00,ar);
  *(undefined ***)(in_RDI->smallend).vect = &PTR__BaseFab_01803888;
  pcVar1 = dataPtr((BaseFab<char> *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                   (int)((ulong)in_RDI >> 0x20));
  *(char **)((in_RDI->bigend).vect + 1) = pcVar1;
  *(undefined8 *)&in_RDI->btype = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)(in_RDI[1].smallend.vect + 1) = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)in_RDI[1].bigend.vect = *(undefined8 *)(in_RSI + 0x28);
  in_RDI[1].bigend.vect[2] = *(int *)(in_RSI + 0x30);
  in_RDI[1].btype.itype = in_R8D;
  LVar2 = Box::numPts(in_RDI);
  *(long *)in_RDI[2].smallend.vect = (int)in_R8D * LVar2;
  *(undefined1 *)(in_RDI[2].smallend.vect + 2) = 0;
  *(undefined1 *)((long)in_RDI[2].smallend.vect + 9) = 0;
  if (in_EDX == 1) {
    (in_RDI->bigend).vect[1] = 0;
    (in_RDI->bigend).vect[2] = 0;
    define(this_00);
    copy<(amrex::RunOn)0>
              (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000164,
               in_stack_00000158,in_stack_00000154,in_stack_00000420);
  }
  else if (in_EDX != 0) {
    Abort_host((char *)in_RDI);
  }
  return;
}

Assistant:

BaseFab<T>::BaseFab (const BaseFab<T>& rhs, MakeType make_type, int scomp, int ncomp)
    : DataAllocator{rhs.arena()},
      dptr(const_cast<T*>(rhs.dataPtr(scomp))),
      domain(rhs.domain), nvar(ncomp),
      truesize(ncomp*rhs.domain.numPts())
{
    AMREX_ASSERT(scomp+ncomp <= rhs.nComp());
    if (make_type == amrex::make_deep_copy)
    {
        this->dptr = nullptr;
        define();
        this->copy<RunOn::Device>(rhs, this->domain, scomp, this->domain, 0, ncomp);
    } else if (make_type == amrex::make_alias) {
        ; // nothing to do
    } else {
        amrex::Abort("BaseFab: unknown MakeType");
    }
}